

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

int glfwUpdateGamepadMappings(char *string)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  byte *__s;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  _GLFWmapping *p_Var7;
  char cVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  char *local_6a8;
  undefined4 local_6a0;
  undefined4 local_69c;
  _GLFWmapelement *local_698 [2];
  char *local_688;
  _GLFWmapelement *local_680;
  char *local_678;
  _GLFWmapelement *local_670;
  char *local_668;
  _GLFWmapelement *local_660;
  char *local_658;
  _GLFWmapelement *local_650;
  char *local_648;
  _GLFWmapelement *local_640;
  char *local_638;
  _GLFWmapelement *local_630;
  char *local_628;
  _GLFWmapelement *local_620;
  char *local_618;
  _GLFWmapelement *local_610;
  char *local_608;
  _GLFWmapelement *local_600;
  char *local_5f8;
  _GLFWmapelement *local_5f0;
  char *local_5e8;
  _GLFWmapelement *local_5e0;
  char *local_5d8;
  _GLFWmapelement *local_5d0;
  char *local_5c8;
  _GLFWmapelement *local_5c0;
  char *local_5b8;
  _GLFWmapelement *local_5b0;
  char *local_5a8;
  _GLFWmapelement *local_5a0;
  char *local_598;
  _GLFWmapelement *local_590;
  char *local_588;
  _GLFWmapelement *local_580;
  char *local_578;
  _GLFWmapelement *local_570;
  char *local_568;
  _GLFWmapelement *local_560;
  char *local_558;
  _GLFWmapelement *local_550;
  char *local_548;
  _GLFWmapelement *local_540;
  _GLFWmapping mapping;
  char line [1024];
  
  if (string == (char *)0x0) {
    __assert_fail("string != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/glfw/src/input.c"
                  ,0x48a,"int glfwUpdateGamepadMappings(const char *)");
  }
  if (_glfw.initialized == 0) {
    iVar3 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    for (; bVar2 = *string, bVar2 != 0; string = (char *)((byte *)string + (long)__s)) {
      if (((byte)(bVar2 - 0x30) < 10) ||
         ((bVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)))) {
        __s = (byte *)strcspn(string,"\r\n");
        if (__s < (byte *)0x400) {
          memset(&mapping,0,0xf5);
          memcpy(line,string,(size_t)__s);
          local_698[0] = (_GLFWmapelement *)0x19ea46;
          local_698[1] = (_GLFWmapelement *)0x0;
          line[(long)__s] = '\0';
          local_688 = "a";
          local_680 = mapping.buttons;
          local_678 = "b";
          local_670 = mapping.buttons + 1;
          local_668 = "x";
          local_660 = mapping.buttons + 2;
          local_658 = "y";
          local_650 = mapping.buttons + 3;
          local_648 = "back";
          local_640 = mapping.buttons + 6;
          local_638 = "start";
          local_630 = mapping.buttons + 7;
          local_628 = "guide";
          local_620 = mapping.buttons + 8;
          local_618 = "leftshoulder";
          local_610 = mapping.buttons + 4;
          local_608 = "rightshoulder";
          local_600 = mapping.buttons + 5;
          local_5f8 = "leftstick";
          local_5f0 = mapping.buttons + 9;
          local_5e8 = "rightstick";
          local_5e0 = mapping.buttons + 10;
          local_5d8 = "dpup";
          local_5d0 = mapping.buttons + 0xb;
          local_5c8 = "dpright";
          local_5c0 = mapping.buttons + 0xc;
          local_5b8 = "dpdown";
          local_5b0 = mapping.buttons + 0xd;
          local_5a8 = "dpleft";
          local_5a0 = mapping.buttons + 0xe;
          local_598 = "lefttrigger";
          local_590 = mapping.axes + 4;
          local_588 = "righttrigger";
          local_580 = mapping.axes + 5;
          local_578 = "leftx";
          local_570 = mapping.axes;
          local_568 = "lefty";
          local_560 = mapping.axes + 1;
          local_558 = "rightx";
          local_550 = mapping.axes + 2;
          local_548 = "righty";
          local_540 = mapping.axes + 3;
          local_6a8 = line;
          sVar4 = strcspn(line,",");
          if ((sVar4 == 0x20) && (line[0x20] == ',')) {
            mapping.guid[0x10] = line[0x10];
            mapping.guid[0x11] = line[0x11];
            mapping.guid[0x12] = line[0x12];
            mapping.guid[0x13] = line[0x13];
            mapping.guid[0x14] = line[0x14];
            mapping.guid[0x15] = line[0x15];
            mapping.guid[0x16] = line[0x16];
            mapping.guid[0x17] = line[0x17];
            mapping.guid[0x18] = line[0x18];
            mapping.guid[0x19] = line[0x19];
            mapping.guid[0x1a] = line[0x1a];
            mapping.guid[0x1b] = line[0x1b];
            mapping.guid[0x1c] = line[0x1c];
            mapping.guid[0x1d] = line[0x1d];
            mapping.guid[0x1e] = line[0x1e];
            mapping.guid[0x1f] = line[0x1f];
            mapping.guid[0] = line[0];
            mapping.guid[1] = line[1];
            mapping.guid[2] = line[2];
            mapping.guid[3] = line[3];
            mapping.guid[4] = line[4];
            mapping.guid[5] = line[5];
            mapping.guid[6] = line[6];
            mapping.guid[7] = line[7];
            mapping.guid[8] = line[8];
            mapping.guid[9] = line[9];
            mapping.guid[10] = line[10];
            mapping.guid[0xb] = line[0xb];
            mapping.guid[0xc] = line[0xc];
            mapping.guid[0xd] = line[0xd];
            mapping.guid[0xe] = line[0xe];
            mapping.guid[0xf] = line[0xf];
            sVar4 = strcspn(line + 0x21,",");
            if ((sVar4 < 0x80) && (line[sVar4 + 0x21] == ',')) {
              memcpy(&mapping,line + 0x21,sVar4);
              pcVar11 = line + sVar4 + 0x22;
LAB_00145730:
              cVar8 = *pcVar11;
              local_6a8 = pcVar11;
              if ((cVar8 != '-') && (cVar8 != '+')) {
                if (cVar8 != '\0') goto code_r0x00145753;
                for (lVar13 = 0x80; lVar13 != 0xa0; lVar13 = lVar13 + 1) {
                  if ((byte)(mapping.name[lVar13] + 0xbfU) < 6) {
                    mapping.name[lVar13] = mapping.name[lVar13] | 0x20;
                  }
                }
                _glfwPlatformUpdateGamepadGUID(mapping.guid);
                p_Var7 = findMapping(mapping.guid);
                if (p_Var7 == (_GLFWmapping *)0x0) {
                  lVar13 = (long)_glfw.mappingCount;
                  _glfw.mappingCount = (int)(lVar13 + 1);
                  _glfw.mappings = (_GLFWmapping *)realloc(_glfw.mappings,(lVar13 + 1) * 0xf5);
                  p_Var7 = _glfw.mappings + (long)_glfw.mappingCount + -1;
                }
                memcpy(p_Var7,&mapping,0xf5);
              }
              goto LAB_00145910;
            }
          }
          _glfwInputError(0x10004,(char *)0x0);
        }
      }
      else {
        sVar4 = strcspn(string,"\r\n");
        __s = (byte *)string + sVar4;
        string = (char *)strspn((char *)__s,"\r\n");
      }
LAB_00145910:
    }
    iVar3 = 1;
    for (lVar13 = 0; lVar13 != 0x1fa00; lVar13 = lVar13 + 0x1fa0) {
      if (*(int *)(_glfw.joysticks[0].guid + lVar13 + -0x48) != 0) {
        p_Var7 = findValidMapping((_GLFWjoystick *)(_glfw.joysticks[0].guid + lVar13 + -0x48));
        *(_GLFWmapping **)(_glfw.joysticks[0].linjs.path + lVar13 + -0xc) = p_Var7;
      }
    }
  }
  return iVar3;
code_r0x00145753:
  for (lVar13 = 8; lVar13 != 0x168; lVar13 = lVar13 + 0x10) {
    pcVar12 = *(char **)((long)&local_6a0 + lVar13);
    sVar4 = strlen(pcVar12);
    iVar3 = strncmp(pcVar11,pcVar12,sVar4);
    if ((iVar3 == 0) && (pcVar11[sVar4] == ':')) {
      pcVar12 = pcVar11 + sVar4 + 1;
      pcVar1 = *(char **)((long)local_698 + lVar13);
      if (pcVar1 == (char *)0x0) {
        local_6a8 = pcVar12;
        iVar3 = strncmp(pcVar12,"Linux",5);
        pcVar11 = pcVar12;
        if (iVar3 != 0) goto LAB_00145910;
        break;
      }
      cVar8 = *pcVar12;
      if (cVar8 == '+') {
        uVar10 = 0;
        uVar9 = 1;
LAB_00145817:
        pcVar12 = pcVar11 + sVar4 + 2;
        cVar8 = pcVar11[sVar4 + 2];
      }
      else {
        uVar10 = 0xffffffff;
        uVar9 = 1;
        if (cVar8 == '-') {
          uVar9 = 0;
          goto LAB_00145817;
        }
      }
      local_6a8 = pcVar12;
      if (cVar8 == 'a') {
        cVar8 = '\x01';
LAB_00145890:
        *pcVar1 = cVar8;
        local_6a0 = uVar10;
        local_69c = uVar9;
        uVar6 = strtoul(pcVar12 + 1,&local_6a8,10);
        bVar2 = (byte)uVar6;
      }
      else {
        if (cVar8 != 'h') {
          pcVar11 = pcVar12;
          if (cVar8 == 'b') {
            cVar8 = '\x02';
            goto LAB_00145890;
          }
          break;
        }
        *pcVar1 = '\x03';
        local_6a0 = uVar10;
        local_69c = uVar9;
        uVar6 = strtoul(pcVar12 + 1,&local_6a8,10);
        uVar5 = strtoul(local_6a8 + 1,&local_6a8,10);
        bVar2 = (byte)(uVar6 << 4) | (byte)uVar5;
      }
      pcVar1[1] = bVar2;
      pcVar11 = local_6a8;
      if (*pcVar1 == '\x01') {
        bVar2 = 2 / (byte)((char)local_69c - (char)local_6a0);
        pcVar1[2] = bVar2;
        cVar8 = (char)local_69c + (char)local_6a0;
        pcVar1[3] = -cVar8;
        if (*local_6a8 == '~') {
          pcVar1[2] = -bVar2;
          pcVar1[3] = cVar8;
        }
      }
      break;
    }
  }
  sVar4 = strcspn(pcVar11,",");
  pcVar11 = pcVar11 + sVar4;
  local_6a8 = pcVar11;
  sVar4 = strspn(pcVar11,",");
  pcVar11 = pcVar11 + sVar4;
  goto LAB_00145730;
}

Assistant:

GLFWAPI int glfwUpdateGamepadMappings(const char* string)
{
    int jid;
    const char* c = string;

    assert(string != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    while (*c)
    {
        if ((*c >= '0' && *c <= '9') ||
            (*c >= 'a' && *c <= 'f') ||
            (*c >= 'A' && *c <= 'F'))
        {
            char line[1024];

            const size_t length = strcspn(c, "\r\n");
            if (length < sizeof(line))
            {
                _GLFWmapping mapping = {{0}};

                memcpy(line, c, length);
                line[length] = '\0';

                if (parseMapping(&mapping, line))
                {
                    _GLFWmapping* previous = findMapping(mapping.guid);
                    if (previous)
                        *previous = mapping;
                    else
                    {
                        _glfw.mappingCount++;
                        _glfw.mappings =
                            realloc(_glfw.mappings,
                                    sizeof(_GLFWmapping) * _glfw.mappingCount);
                        _glfw.mappings[_glfw.mappingCount - 1] = mapping;
                    }
                }
            }

            c += length;
        }
        else
        {
            c += strcspn(c, "\r\n");
            c += strspn(c, "\r\n");
        }
    }

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        _GLFWjoystick* js = _glfw.joysticks + jid;
        if (js->present)
            js->mapping = findValidMapping(js);
    }

    return GLFW_TRUE;
}